

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::LevelSpawned(AActor *this)

{
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  bool bVar4;
  Self local_1c;
  TFlags<ActorFlag,_unsigned_int> local_18;
  TFlags<ActorFlag4,_unsigned_int> local_14;
  AActor *local_10;
  AActor *this_local;
  
  bVar4 = false;
  local_10 = this;
  if (0 < this->tics) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_14,
               (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
    bVar4 = uVar1 == 0;
  }
  if (bVar4) {
    iVar2 = FRandom::operator()(&pr_spawnmapthing);
    this->tics = iVar2 % this->tics + 1;
  }
  pAVar3 = GetDefault(this);
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_18,
             (int)pAVar3 +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_18);
  if (uVar1 == 0) {
    operator~((EnumType)&local_1c);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_1c);
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[0xb])();
  return;
}

Assistant:

void AActor::LevelSpawned ()
{
	if (tics > 0 && !(flags4 & MF4_SYNCHRONIZED))
	{
		tics = 1 + (pr_spawnmapthing() % tics);
	}
	// [RH] Clear MF_DROPPED flag if the default version doesn't have it set.
	// (AInventory::BeginPlay() makes all inventory items spawn with it set.)
	if (!(GetDefault()->flags & MF_DROPPED))
	{
		flags &= ~MF_DROPPED;
	}
	HandleSpawnFlags ();
}